

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

Component __thiscall ftxui::ComponentBase::ActiveChild(ComponentBase *this)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  Component CVar4;
  Component CVar5;
  Component CVar6;
  
  psVar1 = (this->children_).
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 == (this->children_).
                super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    in_RDI->_vptr_ComponentBase = (_func_int **)0x0;
    (in_RDI->children_).
    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         in_RDX._M_pi;
    CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (Component)CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
  }
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (psVar1->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  in_RDI->_vptr_ComponentBase = (_func_int **)_Var3._M_pi;
  p_Var2 = (psVar1->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (in_RDI->children_).
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (Component)CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  CVar6.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar6.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Component)CVar6.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component ComponentBase::ActiveChild() {
  return children_.empty() ? nullptr : children_.front();
}